

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

bool __thiscall jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,Object *object)

{
  pointer pOVar1;
  int iVar2;
  Fodder *fodder;
  pointer pOVar3;
  
  pOVar3 = (object->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (object->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pOVar3 == pOVar1) {
      iVar2 = countNewlines(&object->closeFodder);
      return 0 < iVar2;
    }
    fodder = &pOVar3->fodder1;
    if (pOVar3->kind == FIELD_STR) {
      fodder = &pOVar3->expr1->openFodder;
    }
    iVar2 = countNewlines(fodder);
    pOVar3 = pOVar3 + 1;
  } while (iVar2 < 1);
  return true;
}

Assistant:

bool shouldExpand(Object *object)
    {
        for (auto &field : object->fields) {
            if (countNewlines(objectFieldOpenFodder(field)) > 0) {
                return true;
            }
        }
        if (countNewlines(object->closeFodder) > 0) {
            return true;
        }
        return false;
    }